

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O3

bool __thiscall
OSSLEDDSA::generateKeyPair
          (OSSLEDDSA *this,AsymmetricKeyPair **ppKeyPair,AsymmetricParameters *parameters,
          RNG *param_3)

{
  int iVar1;
  ByteString *byteString;
  EVP_PKEY_CTX *ctx;
  AsymmetricKeyPair *__s;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar2;
  char *pcVar3;
  EVP_PKEY *pkey;
  EVP_PKEY *local_20;
  
  if (parameters != (AsymmetricParameters *)0x0 && ppKeyPair != (AsymmetricKeyPair **)0x0) {
    iVar1 = (*(parameters->super_Serialisable)._vptr_Serialisable[3])(parameters);
    if ((char)iVar1 == '\0') {
      pcVar3 = "Invalid parameters supplied for EDDSA key generation";
      iVar1 = 0xef;
    }
    else {
      byteString = ECParameters::getEC((ECParameters *)parameters);
      iVar1 = OSSL::byteString2oid(byteString);
      local_20 = (EVP_PKEY *)0x0;
      ctx = EVP_PKEY_CTX_new_id(iVar1,(ENGINE *)0x0);
      if (ctx != (EVP_PKEY_CTX *)0x0) {
        iVar1 = EVP_PKEY_keygen_init(ctx);
        if (iVar1 == 1) {
          iVar1 = EVP_PKEY_keygen(ctx,&local_20);
          if (iVar1 == 1) {
            EVP_PKEY_CTX_free(ctx);
            __s = (AsymmetricKeyPair *)operator_new(0xd8);
            memset(__s,0,0xd8);
            (__s->super_Serialisable)._vptr_Serialisable = (_func_int **)&PTR_serialise_0019cbb0;
            OSSLEDPublicKey::OSSLEDPublicKey((OSSLEDPublicKey *)(__s + 1));
            OSSLEDPrivateKey::OSSLEDPrivateKey((OSSLEDPrivateKey *)(__s + 0xe));
            iVar1 = (*(__s->super_Serialisable)._vptr_Serialisable[3])(__s);
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x60))
                      ((long *)CONCAT44(extraout_var,iVar1),local_20);
            iVar1 = (*(__s->super_Serialisable)._vptr_Serialisable[5])(__s);
            (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x70))
                      ((long *)CONCAT44(extraout_var_00,iVar1),local_20);
            *ppKeyPair = __s;
            EVP_PKEY_free(local_20);
            return true;
          }
          uVar2 = ERR_get_error();
          pcVar3 = "EDDSA key generation failed (0x%08X)";
          iVar1 = 0x10a;
        }
        else {
          uVar2 = ERR_get_error();
          pcVar3 = "EDDSA key generation init failed (0x%08X)";
          iVar1 = 0x103;
        }
        softHSMLog(3,"generateKeyPair",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                   ,iVar1,pcVar3,uVar2);
        EVP_PKEY_CTX_free(ctx);
        return false;
      }
      pcVar3 = "Failed to instantiate OpenSSL EDDSA context";
      iVar1 = 0xfc;
    }
    softHSMLog(3,"generateKeyPair",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
               ,iVar1,pcVar3);
  }
  return false;
}

Assistant:

bool OSSLEDDSA::generateKeyPair(AsymmetricKeyPair** ppKeyPair, AsymmetricParameters* parameters, RNG* /*rng = NULL */)
{
	// Check parameters
	if ((ppKeyPair == NULL) ||
	    (parameters == NULL))
	{
		return false;
	}

	if (!parameters->areOfType(ECParameters::type))
	{
		ERROR_MSG("Invalid parameters supplied for EDDSA key generation");

		return false;
	}

	ECParameters* params = (ECParameters*) parameters;
	int nid = OSSL::byteString2oid(params->getEC());

	// Generate the key-pair
	EVP_PKEY* pkey = NULL;
	EVP_PKEY_CTX* ctx = EVP_PKEY_CTX_new_id(nid, NULL);
	if (ctx == NULL)
	{
		ERROR_MSG("Failed to instantiate OpenSSL EDDSA context");

		return false;
	}
	int ret = EVP_PKEY_keygen_init(ctx);
	if (ret != 1)
	{
		ERROR_MSG("EDDSA key generation init failed (0x%08X)", ERR_get_error());
		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	ret = EVP_PKEY_keygen(ctx, &pkey);
	if (ret != 1)
	{
		ERROR_MSG("EDDSA key generation failed (0x%08X)", ERR_get_error());
		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	EVP_PKEY_CTX_free(ctx);

	// Create an asymmetric key-pair object to return
	OSSLEDKeyPair* kp = new OSSLEDKeyPair();

	((OSSLEDPublicKey*) kp->getPublicKey())->setFromOSSL(pkey);
	((OSSLEDPrivateKey*) kp->getPrivateKey())->setFromOSSL(pkey);

	*ppKeyPair = kp;

	// Release the key
	EVP_PKEY_free(pkey);

	return true;
}